

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O0

void __thiscall
pstore::lock_guard<pstore::transaction_mutex>::lock_guard
          (lock_guard<pstore::transaction_mutex> *this,transaction_mutex *mut)

{
  transaction_mutex *mut_local;
  lock_guard<pstore::transaction_mutex> *this_local;
  
  transaction_mutex::transaction_mutex(&this->mut_,mut);
  this->owned_ = false;
  transaction_mutex::lock(&this->mut_);
  this->owned_ = true;
  return;
}

Assistant:

explicit lock_guard (MutexType && mut)
                : mut_{std::move (mut)} {
            mut_.lock ();
            owned_ = true;
        }